

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O2

void __thiscall duckdb::ColumnSegment::Resize(ColumnSegment *this,idx_t new_size)

{
  BufferManager *pBVar1;
  data_ptr_t __dest;
  data_ptr_t __src;
  BlockHandle *pBVar2;
  shared_ptr<duckdb::BlockHandle,_true> new_block;
  BufferHandle new_handle;
  BufferHandle old_handle;
  
  pBVar1 = BufferManager::GetBufferManager(this->db);
  (*pBVar1->_vptr_BufferManager[7])(&old_handle,pBVar1,&this->block);
  (*pBVar1->_vptr_BufferManager[4])(&new_handle,pBVar1,9,new_size,1);
  ::std::__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)&new_block,
             (__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)&new_handle);
  __dest = BufferHandle::Ptr(&new_handle);
  __src = BufferHandle::Ptr(&old_handle);
  switchD_016b0717::default(__dest,__src,this->segment_size);
  pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&new_block);
  this->block_id = pBVar2->block_id;
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&this->block,&new_block);
  this->segment_size = new_size;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  BufferHandle::~BufferHandle(&new_handle);
  BufferHandle::~BufferHandle(&old_handle);
  return;
}

Assistant:

void ColumnSegment::Resize(idx_t new_size) {
	D_ASSERT(new_size > segment_size);
	D_ASSERT(offset == 0);
	D_ASSERT(block && new_size <= GetBlockManager().GetBlockSize());

	auto &buffer_manager = BufferManager::GetBufferManager(db);
	auto old_handle = buffer_manager.Pin(block);
	auto new_handle = buffer_manager.Allocate(MemoryTag::IN_MEMORY_TABLE, new_size);
	auto new_block = new_handle.GetBlockHandle();
	memcpy(new_handle.Ptr(), old_handle.Ptr(), segment_size);

	this->block_id = new_block->BlockId();
	this->block = std::move(new_block);
	this->segment_size = new_size;
}